

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetbios.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  FILE *__s;
  size_t __n;
  char *__s1;
  char *pcVar4;
  size_t sVar5;
  int cnum;
  int length;
  uint8_t vbios [1048576];
  
  cnum = 0;
  iVar1 = nva_init();
  if (iVar1 != 0) {
    pcVar4 = "PCI init failure!\n";
    sVar5 = 0x12;
LAB_001016c5:
    fwrite(pcVar4,sVar5,1,_stderr);
    return 1;
  }
  pcVar4 = (char *)0x0;
  while( true ) {
    while (__s1 = pcVar4, iVar1 = getopt(argc,argv,"hc:s:"), iVar1 == 99) {
      __isoc99_sscanf(_optarg,"%d",&cnum);
      pcVar4 = __s1;
    }
    if (iVar1 == -1) break;
    pcVar4 = _optarg;
    if ((iVar1 != 0x73) && (pcVar4 = __s1, iVar1 == 0x68)) {
      usage(0);
LAB_001016dd:
      fwrite("Unknown vbios extraction method.\n",0x21,1,_stderr);
      pcVar4 = (char *)0x1;
      usage(1);
      if ((*pcVar4 == 'U') && (pcVar4[1] == -0x56)) {
        uVar3 = (ulong)*(ushort *)(pcVar4 + 0x18);
        if ((((pcVar4[uVar3] == 'P') && (pcVar4[uVar3 + 1] == 'C')) && (pcVar4[uVar3 + 2] == 'I'))
           && (pcVar4[uVar3 + 3] == 'R')) {
          return 1;
        }
        pcVar4 = "Invalid signature(PCIR). You may want to try another retrieval method.\n";
        sVar5 = 0x47;
      }
      else {
        pcVar4 = "Invalid signature(0x55aa). You may want to try another retrieval method.\n";
        sVar5 = 0x49;
      }
      fwrite(pcVar4,sVar5,1,_stderr);
      return -2;
    }
  }
  if (nva_cardsnum <= cnum) {
    if (nva_cardsnum == 0) {
      pcVar4 = "No cards found.\n";
      sVar5 = 0x10;
    }
    else {
      pcVar4 = "No such card.\n";
      sVar5 = 0xe;
    }
    goto LAB_001016c5;
  }
  if (__s1 == (char *)0x0) {
    __s1 = "PRAMIN";
    if (nva_cards[cnum].chipset < 4) {
      __s1 = "PROM";
    }
    fprintf(_stderr,
            "No extraction method specified (using -s extraction_method). Defaulting to %s.\n",__s1)
    ;
  }
  iVar1 = strcasecmp(__s1,"pramin");
  if (iVar1 == 0) {
    iVar1 = vbios_extract_pramin(cnum,vbios,&length);
  }
  else {
    iVar1 = strcasecmp(__s1,"prom");
    if (iVar1 != 0) goto LAB_001016dd;
    iVar1 = vbios_extract_prom(cnum,vbios,&length);
  }
  iVar2 = fileno(_stdout);
  iVar2 = isatty(iVar2);
  if (iVar2 == 0) {
    __n = (size_t)length;
    pcVar4 = (char *)vbios;
    sVar5 = 1;
    __s = _stdout;
  }
  else {
    pcVar4 = "Refusing to write BIOS image to a terminal - please redirect output to a file.\n";
    sVar5 = 0x4f;
    __n = 1;
    __s = _stderr;
  }
  fwrite(pcVar4,sVar5,__n,__s);
  return (uint)(iVar1 != 1);
}

Assistant:

int main(int argc, char **argv) {
	uint8_t vbios[NV_PROM_SIZE];
	int c;
	int cnum =0;
	char const *source = NULL;
	int result = 0;
	int length;

	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}

	/* Arguments parsing */
	while ((c = getopt (argc, argv, "hc:s:")) != -1) {
		switch (c) {
			case 'h':
				usage(0);
				break;
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 's':
				source = optarg;
				break;
		}
	}

	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	if (source == NULL) {
		if (nva_cards[cnum].chipset < 4)
			source = "PROM";
		else
			source = "PRAMIN";
		fprintf(stderr, "No extraction method specified (using -s extraction_method). Defaulting to %s.\n", source);
	}

	/* Extraction */
	if (strcasecmp(source, "pramin") == 0)
		result = vbios_extract_pramin(cnum, vbios, &length);
	else if (strcasecmp(source, "prom") == 0)
		result = vbios_extract_prom(cnum, vbios, &length);
	else {
		fprintf(stderr, "Unknown vbios extraction method.\n");
		usage(1);
	}

	if (isatty(fileno(stdout))) {
		fprintf(stderr, "Refusing to write BIOS image to a terminal - please redirect output to a file.\n");
	} else {
		/* print the vbios on stdout */
		fwrite(vbios, 1, length, stdout);
	}

	return result != EOK;
}